

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int renameColumnExprCb(Walker *pWalker,Expr *pExpr)

{
  RenameCtx *pCtx;
  Parse *pParse;
  
  pCtx = (pWalker->u).pRename;
  if (pExpr->op == 0x9e) {
    if (pCtx->iCol != (int)pExpr->iColumn) {
      return 0;
    }
    if (pCtx->pTab != (pExpr->y).pTab) {
      return 0;
    }
    pParse = pWalker->pParse;
  }
  else {
    if (pExpr->op != 'M') {
      return 0;
    }
    if (pCtx->iCol != (int)pExpr->iColumn) {
      return 0;
    }
    pParse = pWalker->pParse;
    if (pParse->pTriggerTab != pCtx->pTab) {
      return 0;
    }
  }
  renameTokenFind(pParse,pCtx,pExpr);
  return 0;
}

Assistant:

static int renameColumnExprCb(Walker *pWalker, Expr *pExpr){
  RenameCtx *p = pWalker->u.pRename;
  if( pExpr->op==TK_TRIGGER 
   && pExpr->iColumn==p->iCol 
   && pWalker->pParse->pTriggerTab==p->pTab
  ){
    renameTokenFind(pWalker->pParse, p, (void*)pExpr);
  }else if( pExpr->op==TK_COLUMN 
   && pExpr->iColumn==p->iCol 
   && p->pTab==pExpr->y.pTab
  ){
    renameTokenFind(pWalker->pParse, p, (void*)pExpr);
  }
  return WRC_Continue;
}